

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMathematics.cpp
# Opt level: O1

double chrono::ChAtan2(double mcos,double msin)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  
  auVar3._8_56_ = in_register_00001208;
  auVar3._0_8_ = mcos;
  auVar2._8_8_ = 0x7fffffffffffffff;
  auVar2._0_8_ = 0x7fffffffffffffff;
  auVar2 = vandpd_avx512vl(auVar3._0_16_,auVar2);
  if (0.707 <= auVar2._0_8_) {
    auVar4._0_8_ = asin(msin);
    if (mcos < 0.0) {
      auVar4._0_8_ = 3.141592653589793 - auVar4._0_8_;
    }
  }
  else {
    auVar4._0_8_ = acos(mcos);
    auVar4._8_56_ = extraout_var;
    if (msin < 0.0) {
      auVar1._8_8_ = 0x8000000000000000;
      auVar1._0_8_ = 0x8000000000000000;
      auVar2 = vxorpd_avx512vl(auVar4._0_16_,auVar1);
      auVar4._0_8_ = auVar2._0_8_;
    }
  }
  return auVar4._0_8_;
}

Assistant:

double ChAtan2(double mcos, double msin) {
    double ret;
    if (fabs(mcos) < 0.707) {
        ret = acos(mcos);
        if (msin < 0.0)
            ret = -ret;
    } else {
        ret = asin(msin);
        if (mcos < 0.0)
            ret = CH_C_PI - ret;
    }
    return ret;
}